

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::EnhancedLayouts::XFBCaptureInactiveOutputVariableTest::verifyBuffers
          (XFBCaptureInactiveOutputVariableTest *this,bufferCollection *buffers)

{
  ostringstream *this_00;
  pointer ppVar1;
  Buffer *this_01;
  bufferDescriptor *pbVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  GLchar *pGVar6;
  MessageBuilder *this_02;
  undefined1 auVar7 [16];
  undefined1 local_1a0 [384];
  
  ppVar1 = (buffers->m_vector).
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_01 = ppVar1[1].m_buffer;
  pbVar2 = ppVar1[1].m_descriptor;
  Utils::Buffer::Bind(this_01);
  piVar5 = (int *)Utils::Buffer::Map(this_01,ReadOnly);
  piVar3 = *(int **)&(pbVar2->m_expected_data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  auVar7._0_4_ = -(uint)(piVar3[8] == piVar5[8] && *piVar3 == *piVar5);
  auVar7._4_4_ = -(uint)(piVar3[9] == piVar5[9] && piVar3[1] == piVar5[1]);
  auVar7._8_4_ = -(uint)(piVar3[10] == piVar5[10] && piVar3[2] == piVar5[2]);
  auVar7._12_4_ = -(uint)(piVar3[0xb] == piVar5[0xb] && piVar3[3] == piVar5[3]);
  iVar4 = movmskps((int)piVar5,auVar7);
  if (iVar4 != 0xf) {
    local_1a0._0_8_ =
         ((this->super_BufferTestBase).super_TestBase.super_TestCase.m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Invalid result. Buffer: ");
    pGVar6 = Utils::Buffer::GetBufferName(pbVar2->m_target);
    std::operator<<((ostream *)this_00,pGVar6);
    std::operator<<((ostream *)this_00,". Index: ");
    this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&pbVar2->m_index);
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  Utils::Buffer::UnMap(this_01);
  return iVar4 == 0xf;
}

Assistant:

bool XFBCaptureInactiveOutputVariableTest::verifyBuffers(bufferCollection& buffers)
{
	bool result = true;

	bufferCollection::pair& pair	   = buffers.m_vector[1] /* xfb */;
	Utils::Buffer*			buffer	 = pair.m_buffer;
	bufferDescriptor*		descriptor = pair.m_descriptor;

	/* Get pointer to contents of buffer */
	buffer->Bind();
	GLubyte* buffer_data = (GLubyte*)buffer->Map(Utils::Buffer::ReadOnly);

	/* Get pointer to expected data */
	GLubyte* expected_data = (GLubyte*)&descriptor->m_expected_data[0];

	/* Compare */
	static const GLuint vec4_size = 16;

	int res_gohan = memcmp(buffer_data + 2 * vec4_size, expected_data + 2 * vec4_size, vec4_size);
	int res_goten = memcmp(buffer_data + 0 * vec4_size, expected_data + 0 * vec4_size, vec4_size);

	if ((0 != res_gohan) || (0 != res_goten))
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Invalid result. Buffer: " << Utils::Buffer::GetBufferName(descriptor->m_target)
			<< ". Index: " << descriptor->m_index << tcu::TestLog::EndMessage;

		result = false;
	}

	/* Release buffer mapping */
	buffer->UnMap();

	return result;
}